

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_TIFFPredictor.hh
# Opt level: O2

void __thiscall Pl_TIFFPredictor::~Pl_TIFFPredictor(Pl_TIFFPredictor *this)

{
  ~Pl_TIFFPredictor(this);
  operator_delete(this,0x90);
  return;
}

Assistant:

~Pl_TIFFPredictor() override = default;